

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O0

optional<ImageSpec::Origin> __thiscall
ktx::OptionsCreate::parseTexcoordOrigin
          (OptionsCreate *this,ParseResult *args,uint32_t numDimensions,char *argName,
          Reporter *report)

{
  bool bVar1;
  int iVar2;
  Reporter *this_00;
  char (*args_00) [64];
  OptionValue *pOVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  int in_EDX;
  Origin orig;
  smatch sm;
  string *originStr;
  regex re;
  optional<ImageSpec::Origin> result;
  undefined4 in_stack_fffffffffffffd90;
  undefined2 in_stack_fffffffffffffd94;
  undefined1 in_stack_fffffffffffffd96;
  undefined1 in_stack_fffffffffffffd97;
  string *in_stack_fffffffffffffd98;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffda0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffda8;
  string *this_02;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdb0;
  string *in_stack_fffffffffffffdb8;
  string *option;
  ParseResult *in_stack_fffffffffffffdc0;
  ParseResult *this_03;
  char *in_stack_fffffffffffffdc8;
  string *this_04;
  undefined6 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd6;
  undefined1 in_stack_fffffffffffffdd7;
  byte bVar5;
  byte bVar6;
  allocator<char> *args_1;
  string local_1d8 [39];
  undefined1 local_1b1 [33];
  string local_190 [32];
  string local_170 [36];
  Origin local_14c;
  byte local_149;
  string local_148 [87];
  allocator<char> local_f1;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string *local_90;
  allocator<char> local_51;
  string local_50 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  int local_1c;
  _Optional_payload_base<ImageSpec::Origin> local_4;
  
  local_28 = in_RCX;
  local_1c = in_EDX;
  std::optional<ImageSpec::Origin>::optional((optional<ImageSpec::Origin> *)0x22951b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffdd7,
                      CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)),
             in_stack_fffffffffffffdc8,(allocator<char> *)in_stack_fffffffffffffdc0);
  this_00 = (Reporter *)
            cxxopts::ParseResult::operator[](in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  args_00 = (char (*) [64])cxxopts::OptionValue::count((OptionValue *)this_00);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  if (args_00 != (char (*) [64])0x0) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffdd7,
                        CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)),
               in_stack_fffffffffffffdc8,(flag_type)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
    args_1 = &local_f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffdd7,
                        CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)),
               in_stack_fffffffffffffdc8,(allocator<char> *)in_stack_fffffffffffffdc0);
    pOVar3 = cxxopts::ParseResult::operator[](in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    pbVar4 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar3);
    std::__cxx11::string::string(local_d0,(string *)pbVar4);
    to_lower_copy(in_stack_fffffffffffffd98);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator(&local_f1);
    local_90 = local_b0;
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffd97,
                                CONCAT16(in_stack_fffffffffffffd96,
                                         CONCAT24(in_stack_fffffffffffffd94,
                                                  in_stack_fffffffffffffd90))));
    local_148._40_8_ = std::__cxx11::string::begin();
    local_148._32_8_ = std::__cxx11::string::end();
    std::
    regex_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
               (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffd98,
               CONCAT13(in_stack_fffffffffffffd97,
                        CONCAT12(in_stack_fffffffffffffd96,in_stack_fffffffffffffd94)));
    bVar1 = std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::empty((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)0x229723);
    if (bVar1) {
      Reporter::fatal_usage<char_const(&)[64],char_const*&,std::__cxx11::string_const&>
                (this_00,args_00,(char **)args_1,local_28);
    }
    local_149 = 0;
    bVar5 = 0;
    if (local_1c == 3) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)in_stack_fffffffffffffd98,
            CONCAT17(in_stack_fffffffffffffd97,
                     CONCAT16(in_stack_fffffffffffffd96,
                              CONCAT24(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90))));
      local_149 = 1;
      bVar5 = std::__cxx11::string::empty();
    }
    bVar6 = bVar5;
    if ((local_149 & 1) != 0) {
      std::__cxx11::string::~string(local_148);
    }
    if ((bVar5 & 1) != 0) {
      Reporter::fatal_usage<char_const(&)[62],char_const*&>
                (this_00,(char (*) [62])args_00,(char **)args_1);
    }
    ImageSpec::Origin::Origin(&local_14c);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)in_stack_fffffffffffffd98,
          CONCAT17(in_stack_fffffffffffffd97,
                   CONCAT16(in_stack_fffffffffffffd96,
                            CONCAT24(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90))));
    this_04 = local_170;
    iVar2 = std::__cxx11::string::compare((char *)this_04);
    local_14c.x = iVar2 != 0;
    std::__cxx11::string::~string(this_04);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)in_stack_fffffffffffffd98,
          CONCAT17(in_stack_fffffffffffffd97,
                   CONCAT16(in_stack_fffffffffffffd96,
                            CONCAT24(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90))));
    this_02 = local_190;
    iVar2 = std::__cxx11::string::compare((char *)this_02);
    local_14c.y = iVar2 == 0;
    std::__cxx11::string::~string(this_02);
    this_03 = (ParseResult *)local_1b1;
    option = (string *)kCubemap;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar6,CONCAT16(bVar5,in_stack_fffffffffffffdd0)),(char *)this_04,
               (allocator<char> *)this_03);
    pOVar3 = cxxopts::ParseResult::operator[](this_03,option);
    this_01 = (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)cxxopts::OptionValue::count(pOVar3);
    std::__cxx11::string::~string((string *)(local_1b1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1b1);
    if ((this_01 !=
         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *)0x0) && ((local_14c.x != '\0' || (local_14c.y != '\0')))) {
      Reporter::fatal_usage<char_const(&)[46],char_const*&>
                (this_00,(char (*) [46])args_00,(char **)args_1);
    }
    if (local_1c == 3) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(this_01,CONCAT17(in_stack_fffffffffffffd97,
                             CONCAT16(in_stack_fffffffffffffd96,
                                      CONCAT24(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90))
                            ));
      iVar2 = std::__cxx11::string::compare((char *)local_1d8);
      in_stack_fffffffffffffd96 = 1;
      in_stack_fffffffffffffd97 = iVar2 == 0;
      local_14c.z = in_stack_fffffffffffffd97;
      std::__cxx11::string::~string(local_1d8);
    }
    std::optional<ImageSpec::Origin>::operator=
              ((optional<ImageSpec::Origin> *)pOVar3,(Origin *)this_01);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)0x229b22);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffd97,
                        CONCAT16(in_stack_fffffffffffffd96,
                                 CONCAT24(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90))));
  }
  return (_Optional_base<ImageSpec::Origin,_true,_true>)
         (_Optional_base<ImageSpec::Origin,_true,_true>)local_4;
}

Assistant:

std::optional<ImageSpec::Origin> parseTexcoordOrigin(cxxopts::ParseResult& args, uint32_t numDimensions, const char* argName, Reporter& report) const {
        std::optional<ImageSpec::Origin> result;
        if (args[argName].count()) {
            // RE to extract origin for each dimension.
            // - Match 0 is whole matching string.
            // - Match 1 is the y origin.
            // - Match 2 is the x origin.
            // - Match 3 is the z origin. Empty string, if not specified.
            // Use raw literal to avoid excess blackslashes
            std::regex re(R"--((?:\b(top|bottom)\b-)(?:\b(left)\b)(?:-\b(front|back)\b)?)--");
            // For when support for right origin and 1d textures is added.
            //               y dimension made optional ꜜ right added ꜜ
            //std::regex re(R"--((?:\b(top|bottom)\b-)?(?:\b(left|right)\b)(?:-\b(front|back)\b)?)--");

            // "auto" here leads to no matching function call for regex_match.
            const std::string& originStr = to_lower_copy(args[argName].as<std::string>());
            std::smatch sm;
            std::regex_match(originStr.begin(), originStr.end(), sm, re);
#if DEBUG_REGEX
              std::cout << "match size: " << sm.size() << '\n';
              for(uint32_t i = 0; i < sm.size(); i++) {
                  std::cout << "match " << i << ": " << "\"" << sm.str(i) << "\"" << '\n';
              }
#endif
            if (sm.empty()) {
                report.fatal_usage("Invalid or unsupported origin specified as --{} argument: \"{}\".", argName, originStr);
            }
            if (numDimensions == 3 && sm.str(3).empty()) {
                report.fatal_usage("Z origin must be specified in --{} argument for a 3D texture.", argName);
            }

            ImageSpec::Origin orig;
            // Remember, compare returns 0 for a match.
            orig.x = sm.str(2).compare("left") ? ImageSpec::Origin::eRight
                                               : ImageSpec::Origin::eLeft;
            orig.y = sm.str(1).compare("bottom") ? ImageSpec::Origin::eTop
                                                 : ImageSpec::Origin::eBottom;
            if (args[kCubemap].count()) {
                if (orig.x != ImageSpec::Origin::eLeft || orig.y != ImageSpec::Origin::eTop) {
                    report.fatal_usage("--{} argument must be top-left for a cubemap.", argName);
                }
            }
            if (numDimensions == 3)
                orig.z = sm.str(3).compare("front") ? ImageSpec::Origin::eFront
                                                    : ImageSpec::Origin::eBack;
            result = std::move(orig);
        }

        return result;
    }